

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRepBtree * __thiscall
absl::cord_internal::CordRepBtree::AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  long lVar6;
  OpResult OVar7;
  OpResult OVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  CordRepBtree *pCVar14;
  CordRepBtree *pCVar15;
  CordRepBtree *pCVar16;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *pSVar17;
  CordRepBtree *extra_00;
  long lVar18;
  CordRepBtree *pCVar19;
  Action AVar20;
  CordRepBtree *pCVar21;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *pSVar22;
  ulong uVar23;
  CordRepBtree *pCVar24;
  uint uVar25;
  int iVar26;
  CordRepBtree *pCVar27;
  CordRepBtree *unaff_R13;
  uint uVar28;
  bool bVar29;
  string_view data_00;
  string_view sVar30;
  OpResult OVar31;
  OpResult OVar32;
  OpResult OVar33;
  OpResult OVar34;
  OpResult result;
  OpResult result_00;
  OpResult result_01;
  OpResult result_02;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> ops;
  undefined4 local_c8;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *local_b8;
  char *local_b0;
  uint local_98;
  long alStack_90 [12];
  
  extra_00 = (CordRepBtree *)data._M_str;
  sVar30._M_str = (char *)data._M_len;
  if (tree == (CordRepBtree *)0x0) {
    return this;
  }
  bVar2 = (this->super_CordRep).storage[0];
  pCVar27 = (CordRepBtree *)(ulong)bVar2;
  pCVar15 = (CordRepBtree *)0x0;
  pCVar19 = this;
  do {
    if (pCVar27 == pCVar15) {
      uVar28 = (uint)bVar2;
      pCVar15 = pCVar27;
LAB_0017aac7:
      local_98 = ((pCVar19->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) +
                 uVar28;
      uVar25 = (uint)bVar2;
      pCVar21 = (CordRepBtree *)(ulong)uVar28;
      if ((int)uVar28 <= (int)uVar25) {
        pCVar21 = (CordRepBtree *)(ulong)uVar25;
      }
      goto LAB_0017aadf;
    }
    if ((pCVar19->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
      uVar28 = (uint)pCVar15;
      goto LAB_0017aac7;
    }
    alStack_90[(long)pCVar15] = (long)pCVar19;
    pCVar15 = (CordRepBtree *)((long)&(pCVar15->super_CordRep).length + 1);
    pCVar19 = *(CordRepBtree **)
               ((pCVar19->super_CordRep).storage +
               (ulong)(pCVar19->super_CordRep).storage[2] * 8 + -5);
  } while ((pCVar19->super_CordRep).tag == '\x03');
  goto LAB_0017aafb;
  while( true ) {
    alStack_90[(long)pCVar15] = (long)pCVar19;
    pCVar15 = (CordRepBtree *)((long)&(pCVar15->super_CordRep).length + 1);
    pCVar19 = *(CordRepBtree **)
               ((pCVar19->super_CordRep).storage +
               (ulong)(pCVar19->super_CordRep).storage[2] * 8 + -5);
    if ((pCVar19->super_CordRep).tag != '\x03') break;
LAB_0017aadf:
    if (pCVar21 == pCVar15) {
      pCVar15 = (CordRepBtree *)(ulong)local_98;
      pCVar21 = tree;
      local_b8 = (StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)this;
      if ((ulong)(pCVar19->super_CordRep).storage[2] - (ulong)(pCVar19->super_CordRep).storage[1] <
          6) {
        if ((int)uVar25 < (int)local_98) {
          local_c8 = 0;
          pCVar15 = pCVar19;
        }
        else {
          sVar5 = (pCVar19->super_CordRep).length;
          pCVar15 = (CordRepBtree *)operator_new(0x40);
          (pCVar15->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (pCVar15->super_CordRep).length = sVar5;
          *(undefined4 *)((long)pCVar15->edges_ + 0x2c) =
               *(undefined4 *)((long)pCVar19->edges_ + 0x2c);
          uVar9 = *(undefined8 *)&(pCVar19->super_CordRep).tag;
          uVar10 = *(undefined8 *)((long)pCVar19->edges_ + 4);
          uVar11 = *(undefined8 *)((long)pCVar19->edges_ + 0xc);
          uVar12 = *(undefined8 *)((long)pCVar19->edges_ + 0x14);
          uVar13 = *(undefined8 *)((long)pCVar19->edges_ + 0x24);
          *(undefined8 *)((long)pCVar15->edges_ + 0x1c) =
               *(undefined8 *)((long)pCVar19->edges_ + 0x1c);
          *(undefined8 *)((long)pCVar15->edges_ + 0x24) = uVar13;
          *(undefined8 *)((long)pCVar15->edges_ + 0xc) = uVar11;
          *(undefined8 *)((long)pCVar15->edges_ + 0x14) = uVar12;
          *(undefined8 *)&(pCVar15->super_CordRep).tag = uVar9;
          *(undefined8 *)((long)pCVar15->edges_ + 4) = uVar10;
          bVar3 = (pCVar19->super_CordRep).storage[1];
          bVar4 = (pCVar19->super_CordRep).storage[2];
          if (bVar3 != bVar4) {
            lVar18 = (ulong)bVar3 << 3;
            do {
              lVar6 = *(long *)((long)pCVar19->edges_ + lVar18);
              if (lVar6 == 0) {
                __assert_fail("rep != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                              ,0x38f,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)")
                ;
              }
              LOCK();
              piVar1 = (int *)(lVar6 + 8);
              *piVar1 = *piVar1 + 2;
              UNLOCK();
              lVar18 = lVar18 + 8;
            } while ((ulong)bVar4 * 8 != lVar18);
          }
          local_c8 = 1;
        }
        sVar30._M_len = (size_t)tree;
        pCVar19 = extra_00;
        sVar30 = AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
                           (pCVar15,sVar30,(size_t)extra_00);
        pCVar21 = (CordRepBtree *)sVar30._M_len;
        local_b0 = sVar30._M_str;
        if (pCVar21 == (CordRepBtree *)0x0) {
          (pCVar15->super_CordRep).length =
               (size_t)((tree->super_CordRep).storage + ((pCVar15->super_CordRep).length - 0xd));
          OVar8.action = local_c8;
          OVar8.tree = pCVar15;
          OVar8._12_4_ = 0;
          OVar32.action = local_c8;
          OVar32.tree = pCVar15;
          OVar32._12_4_ = 0;
          if (pCVar27 == (CordRepBtree *)0x0) {
LAB_0017acf1:
            result_00.tree = OVar32._8_8_;
            result_00._8_8_ = pCVar19;
            unaff_R13 = anon_unknown_0::
                        StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::Finalize
                                  ((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                    *)this,OVar32.tree,result_00);
            tree = pCVar19;
          }
          else {
            uVar23 = (ulong)(bVar2 - 1);
            pCVar15 = pCVar27;
            OVar32 = OVar8;
            while( true ) {
              uVar23 = uVar23 - 1;
              unaff_R13 = (CordRepBtree *)alStack_90[(long)((long)pCVar15[-1].edges_ + 0x2f)];
              AVar20 = OVar32.action;
              if (AVar20 != kCopied) break;
              OVar32 = SetEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                 (unaff_R13,(long)pCVar15 <= (long)(int)local_98,
                                  &(OVar32.tree)->super_CordRep,(size_t)tree);
LAB_0017ace1:
              bVar29 = (long)pCVar15 < 2;
              pCVar19 = tree;
              pCVar15 = (CordRepBtree *)((long)pCVar15[-1].edges_ + 0x2f);
              if (bVar29) goto LAB_0017acf1;
            }
            if (AVar20 == kPopped) {
              OVar32 = AddEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                 (unaff_R13,(long)pCVar15 <= (long)(int)local_98,
                                  &(OVar32.tree)->super_CordRep,(size_t)tree);
              goto LAB_0017ace1;
            }
            if (AVar20 != kSelf) goto LAB_0017ace1;
            (unaff_R13->super_CordRep).length =
                 (size_t)((tree->super_CordRep).storage + ((unaff_R13->super_CordRep).length - 0xd))
            ;
            if (1 < (long)pCVar15) {
              do {
                unaff_R13 = (CordRepBtree *)alStack_90[uVar23 & 0xffffffff];
                (unaff_R13->super_CordRep).length =
                     (size_t)((tree->super_CordRep).storage +
                             ((unaff_R13->super_CordRep).length - 0xd));
                uVar28 = (int)pCVar15 - 1;
                pCVar15 = (CordRepBtree *)(ulong)uVar28;
                uVar23 = uVar23 - 1;
              } while (1 < (int)uVar28);
            }
          }
        }
        else {
          unaff_R13 = (CordRepBtree *)((long)tree - (long)pCVar21);
          if (unaff_R13 == (CordRepBtree *)0x0) {
            __assert_fail("delta > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x275,
                          "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                         );
          }
          (pCVar15->super_CordRep).length =
               (size_t)((unaff_R13->super_CordRep).storage + ((pCVar15->super_CordRep).length - 0xd)
                       );
          OVar7.action = local_c8;
          OVar7.tree = pCVar15;
          OVar7._12_4_ = 0;
          OVar31.action = local_c8;
          OVar31.tree = pCVar15;
          OVar31._12_4_ = 0;
          if (pCVar27 == (CordRepBtree *)0x0) {
LAB_0017ac4a:
            result.tree = OVar31._8_8_;
            result._8_8_ = pCVar19;
            this = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
                   Finalize((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)this,
                            OVar31.tree,result);
          }
          else {
            uVar23 = (ulong)(bVar2 - 1);
            pCVar15 = pCVar27;
            OVar31 = OVar7;
            while( true ) {
              uVar23 = uVar23 - 1;
              pSVar17 = (StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)
                        alStack_90[(long)((long)pCVar15[-1].edges_ + 0x2f)];
              AVar20 = OVar31.action;
              if (AVar20 != kCopied) break;
              pCVar19 = unaff_R13;
              OVar31 = SetEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                 ((CordRepBtree *)pSVar17,(long)pCVar15 <= (long)(int)local_98,
                                  &(OVar31.tree)->super_CordRep,(size_t)unaff_R13);
              alStack_90[(long)((long)pCVar15[-1].edges_ + 0x2f)] = (long)OVar31.tree;
LAB_0017ac3a:
              bVar29 = (long)pCVar15 < 2;
              pCVar15 = (CordRepBtree *)((long)pCVar15[-1].edges_ + 0x2f);
              if (bVar29) goto LAB_0017ac4a;
            }
            if (AVar20 != kSelf) {
              if (AVar20 == kPopped) {
                __assert_fail("!propagate",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                              ,0x141,
                              "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack, propagate = true]"
                             );
              }
              goto LAB_0017ac3a;
            }
            *(uint8_t **)pSVar17 = (unaff_R13->super_CordRep).storage + *(long *)pSVar17 + -0xd;
            this = (CordRepBtree *)pSVar17;
            if (1 < (long)pCVar15) {
              do {
                this = (CordRepBtree *)alStack_90[uVar23 & 0xffffffff];
                *(uint8_t **)this = (unaff_R13->super_CordRep).storage + *(long *)this + -0xd;
                uVar28 = (int)pCVar15 - 1;
                pCVar15 = (CordRepBtree *)(ulong)uVar28;
                uVar23 = uVar23 - 1;
              } while (1 < (int)uVar28);
            }
          }
          local_98 = bVar2 + 1;
          tree = pCVar19;
        }
        pCVar15 = tree;
        sVar30._M_str = local_b0;
        local_b8 = (StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)this;
        if (pCVar21 == (CordRepBtree *)0x0) {
          return unaff_R13;
        }
      }
      do {
        data_00._M_str = (char *)extra_00;
        data_00._M_len = (size_t)sVar30._M_str;
        pCVar16 = NewLeaf<(absl::cord_internal::CordRepBtree::EdgeType)1>
                            (pCVar21,data_00,(size_t)pCVar15);
        pCVar19 = (CordRepBtree *)(pCVar16->super_CordRep).length;
        iVar26 = (int)pCVar27;
        if ((CordRepBtree *)((long)pCVar21 - (long)pCVar19) == (CordRepBtree *)0x0) {
          pCVar24 = pCVar21;
          if (iVar26 == 0) {
            OVar33._8_8_ = 2;
            OVar33.tree = pCVar16;
          }
          else {
            uVar23 = (ulong)(iVar26 - 1);
            OVar33._8_8_ = 2;
            OVar33.tree = pCVar16;
            pCVar16 = pCVar27;
            pCVar14 = pCVar27;
            do {
              pCVar15 = pCVar14;
              uVar23 = uVar23 - 1;
              unaff_R13 = (CordRepBtree *)alStack_90[(long)((long)pCVar15[-1].edges_ + 0x2f)];
              AVar20 = OVar33.action;
              if (AVar20 == kCopied) {
                OVar33 = SetEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                   (unaff_R13,(long)pCVar15 <= (long)(int)local_98,
                                    &(OVar33.tree)->super_CordRep,(size_t)pCVar21);
              }
              else if (AVar20 == kPopped) {
                OVar33 = AddEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                   (unaff_R13,(long)pCVar15 <= (long)(int)local_98,
                                    &(OVar33.tree)->super_CordRep,(size_t)pCVar21);
              }
              else if (AVar20 == kSelf) {
                (unaff_R13->super_CordRep).length =
                     (size_t)((pCVar21->super_CordRep).storage +
                             ((unaff_R13->super_CordRep).length - 0xd));
                if ((CordRepBtree *)0x1 < pCVar15) {
                  do {
                    unaff_R13 = (CordRepBtree *)alStack_90[uVar23 & 0xffffffff];
                    (unaff_R13->super_CordRep).length =
                         (size_t)((pCVar21->super_CordRep).storage +
                                 ((unaff_R13->super_CordRep).length - 0xd));
                    uVar28 = (int)pCVar16 - 1;
                    pCVar16 = (CordRepBtree *)(ulong)uVar28;
                    uVar23 = uVar23 - 1;
                  } while (1 < (int)uVar28);
                }
                goto LAB_0017aefc;
              }
              pCVar16 = (CordRepBtree *)(ulong)((int)pCVar16 - 1);
              pCVar14 = (CordRepBtree *)((long)pCVar15[-1].edges_ + 0x2f);
            } while ((CordRepBtree *)0x1 < pCVar15);
          }
          result_01.tree = OVar33._8_8_;
          result_01._8_8_ = pCVar15;
          unaff_R13 = anon_unknown_0::
                      StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::Finalize
                                (local_b8,OVar33.tree,result_01);
        }
        else {
          if (pCVar21 < pCVar19) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",pCVar19,pCVar21);
          }
          if (iVar26 == 0) {
            OVar34._8_8_ = 2;
            OVar34.tree = pCVar16;
          }
          else {
            uVar23 = (ulong)(iVar26 - 1);
            OVar34._8_8_ = 2;
            OVar34.tree = pCVar16;
            pCVar16 = pCVar27;
            do {
              pCVar15 = pCVar16;
              uVar23 = uVar23 - 1;
              pSVar17 = (StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)
                        alStack_90[(long)((long)pCVar15[-1].edges_ + 0x2f)];
              AVar20 = OVar34.action;
              if (AVar20 == kCopied) {
                OVar34 = SetEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                   ((CordRepBtree *)pSVar17,(long)pCVar15 <= (long)(int)local_98,
                                    &(OVar34.tree)->super_CordRep,(size_t)pCVar19);
              }
              else if (AVar20 == kPopped) {
                OVar34 = AddEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                                   ((CordRepBtree *)pSVar17,(long)pCVar15 <= (long)(int)local_98,
                                    &(OVar34.tree)->super_CordRep,(size_t)pCVar19);
              }
              else if (AVar20 == kSelf) {
                *(uint8_t **)pSVar17 = (pCVar19->super_CordRep).storage + *(long *)pSVar17 + -0xd;
                if ((CordRepBtree *)0x1 < pCVar15) {
                  do {
                    pSVar17 = (StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)
                              alStack_90[uVar23 & 0xffffffff];
                    *(uint8_t **)pSVar17 =
                         (pCVar19->super_CordRep).storage + *(long *)pSVar17 + -0xd;
                    uVar28 = (int)pCVar27 - 1;
                    pCVar27 = (CordRepBtree *)(ulong)uVar28;
                    uVar23 = uVar23 - 1;
                  } while (1 < (int)uVar28);
                }
                goto LAB_0017ae90;
              }
              pCVar27 = (CordRepBtree *)(ulong)((int)pCVar27 - 1);
              pCVar16 = (CordRepBtree *)((long)pCVar15[-1].edges_ + 0x2f);
            } while ((CordRepBtree *)0x1 < pCVar15);
          }
          result_02.tree = OVar34._8_8_;
          result_02._8_8_ = pCVar15;
          pSVar17 = (StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)
                    anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>
                    ::Finalize(local_b8,OVar34.tree,result_02);
LAB_0017ae90:
          bVar2 = *(uint8_t *)((long)((RefcountAndFlags *)pSVar17->stack + 1) + 1);
          pCVar27 = (CordRepBtree *)(ulong)bVar2;
          if (0xb < bVar2) {
            __assert_fail("height <= CordRepBtree::kMaxHeight",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0xff,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                         );
          }
          sVar30._M_str = sVar30._M_str + (long)pCVar19;
          uVar23 = 0;
          pSVar22 = pSVar17;
          while (iVar26 = (((RefcountAndFlags *)pSVar22->stack)->count_).super___atomic_base<int>.
                          _M_i, (uint)bVar2 != uVar23) {
            if (iVar26 != 2) {
              __assert_fail("tree->refcount.IsOne()",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                            ,0x102,
                            "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                           );
            }
            alStack_90[uVar23] = (long)pSVar22;
            uVar23 = uVar23 + 1;
            pSVar22 = *(StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> **)
                       ((RefcountAndFlags *)pSVar22->stack +
                       (ulong)*(uint8_t *)((long)((RefcountAndFlags *)pSVar22->stack + 1) + 3) * 2);
            if (*(uint8_t *)((RefcountAndFlags *)pSVar22->stack + 1) != '\x03') goto LAB_0017aafb;
          }
          if (iVar26 != 2) {
            __assert_fail("tree->refcount.IsOne()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x106,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                         );
          }
          local_98 = bVar2 + 1;
          pCVar24 = (CordRepBtree *)((long)pCVar21 - (long)pCVar19);
          local_b8 = pSVar17;
        }
LAB_0017aefc:
        bVar29 = pCVar21 == pCVar19;
        pCVar15 = pCVar21;
        pCVar21 = pCVar24;
        if (bVar29) {
          return unaff_R13;
        }
      } while( true );
    }
  }
LAB_0017aafb:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}